

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::newClausesToUnprocessed(SaturationAlgorithm *this)

{
  bool bVar1;
  Store SVar2;
  ClauseStack *this_00;
  Clause *pCVar3;
  long in_RDI;
  Clause *cl;
  undefined8 in_stack_ffffffffffffffd8;
  uint len;
  SaturationAlgorithm *in_stack_ffffffffffffffe0;
  
  len = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = Shell::Options::randomTraversals(Lib::env);
  if (bVar1) {
    this_00 = Kernel::RCClauseStack::naked((RCClauseStack *)(in_RDI + 0x30));
    in_stack_ffffffffffffffe0 = (SaturationAlgorithm *)Lib::Stack<Kernel::Clause_*>::begin(this_00);
    Kernel::RCClauseStack::size((RCClauseStack *)0xad0be1);
    Shell::Shuffling::shuffleArray<Kernel::Clause*>((Clause **)in_stack_ffffffffffffffe0,len);
  }
  while (bVar1 = Kernel::RCClauseStack::isNonEmpty((RCClauseStack *)0xad0bfd), bVar1) {
    pCVar3 = Kernel::RCClauseStack::popWithoutDec((RCClauseStack *)0xad0c11);
    SVar2 = Kernel::Clause::store(pCVar3);
    pCVar3 = (Clause *)(ulong)SVar2;
    switch(pCVar3) {
    case (Clause *)0x0:
      onNonRedundantClause(in_stack_ffffffffffffffe0,pCVar3);
      break;
    case (Clause *)0x2:
      break;
    case (Clause *)0x3:
      addUnprocessedClause(in_stack_ffffffffffffffe0,pCVar3);
    }
    Kernel::Clause::decRefCnt((Clause *)0xad0c6d);
  }
  return;
}

Assistant:

void SaturationAlgorithm::newClausesToUnprocessed()
{
  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Shuffling::shuffleArray(_newClauses.naked().begin(), _newClauses.size());
  }

  while (_newClauses.isNonEmpty()) {
    Clause* cl = _newClauses.popWithoutDec();
    switch (cl->store()) {
      case Clause::UNPROCESSED:
        break;
      case Clause::PASSIVE:
        onNonRedundantClause(cl);
        break;
      case Clause::NONE:
        addUnprocessedClause(cl);
        break;
      case Clause::SELECTED:
      case Clause::ACTIVE:
#if VDEBUG
        cout << "FAIL: " << cl->toString() << endl;
        // such clauses should not appear as new ones
        cout << cl->toString() << endl;
#endif
        ASSERTION_VIOLATION_REP(cl->store());
    }
    cl->decRefCnt(); // belongs to _newClauses.popWithoutDec()
  }
}